

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Sym * update_additional_D_Sym(D_Scope *st,D_Sym *sym,int sizeof_D_Sym)

{
  D_Scope *pDVar1;
  D_Sym *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  D_Sym *pDVar7;
  D_Sym *pDVar8;
  D_Sym *pDVar9;
  
  pDVar7 = current_D_Sym(st,sym);
  pDVar8 = (D_Sym *)malloc((long)sizeof_D_Sym);
  iVar3 = pDVar7->len;
  uVar4 = pDVar7->hash;
  pDVar1 = pDVar7->scope;
  pDVar9 = pDVar7->update_of;
  pDVar2 = pDVar7->next;
  uVar5 = pDVar7->user;
  uVar6 = *(undefined4 *)&pDVar7->field_0x2c;
  pDVar8->name = pDVar7->name;
  pDVar8->len = iVar3;
  pDVar8->hash = uVar4;
  pDVar8->scope = pDVar1;
  pDVar8->update_of = pDVar9;
  pDVar8->next = pDVar2;
  pDVar8->user = uVar5;
  *(undefined4 *)&pDVar8->field_0x2c = uVar6;
  pDVar9 = pDVar7->update_of;
  if (pDVar7->update_of == (D_Sym *)0x0) {
    pDVar9 = pDVar7;
  }
  pDVar8->update_of = pDVar9;
  pDVar8->next = st->updates;
  st->updates = pDVar8;
  return pDVar8;
}

Assistant:

D_Sym *update_additional_D_Sym(D_Scope *st, D_Sym *sym, int sizeof_D_Sym) {
  D_Sym *s;

  sym = current_D_Sym(st, sym);
  s = MALLOC(sizeof_D_Sym);
  memcpy(s, sym, sizeof(D_Sym));
  if (sym->update_of) sym = sym->update_of;
  s->update_of = sym;
  s->next = st->updates;
  st->updates = s;
  return s;
}